

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

void __thiscall
Wasm::WasmBytecodeGenerator::WasmBytecodeGenerator
          (WasmBytecodeGenerator *this,ScriptContext *scriptContext,WasmReaderInfo *readerInfo,
          bool validateOnly)

{
  ArenaAllocator *this_00;
  WasmFunctionInfo *pWVar1;
  WebAssemblyModule *pWVar2;
  bool bVar3;
  uint uVar4;
  IWasmByteCodeWriter *__s;
  WasmBinaryReader *pWVar5;
  
  this->opId = 0;
  this->lastOpId = 1;
  this_00 = &this->m_alloc;
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            (&this_00->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             L"WasmBytecodeGen",&(scriptContext->threadContext->pageAllocator).super_PageAllocator,
             Js::Throw::OutOfMemory,JsUtil::ExternalApi::RecoverUnusedMemory);
  this->isUnreachable = false;
  this->m_scriptContext = scriptContext;
  bVar3 = Simd::IsEnabled();
  WAsmJs::TypedRegisterAllocator::TypedRegisterAllocator
            (&this->mTypedRegisterAllocator,this_00,AllocateRegisterSpace,(uint)!bVar3 << 4);
  this->currentProfileId = 0;
  (this->m_blockInfos).list.
  super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>.buffer = (Type)0x0;
  (this->m_blockInfos).list.
  super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>.count = 0;
  (this->m_blockInfos).list.
  super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>.alloc = this_00;
  (this->m_blockInfos).list.
  super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>._vptr_ReadOnlyList
       = (_func_int **)&PTR_IsReadOnly_0155a078;
  (this->m_blockInfos).list.length = 0;
  (this->m_blockInfos).list.increment = 4;
  (this->m_evalStack).list.
  super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.buffer = (Type)0x0;
  (this->m_evalStack).list.
  super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.count = 0;
  (this->m_evalStack).list.
  super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.alloc = this_00;
  (this->m_evalStack).list.
  super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>._vptr_ReadOnlyList =
       (_func_int **)&PTR_IsReadOnly_0155a020;
  (this->m_evalStack).list.length = 0;
  (this->m_evalStack).list.increment = 4;
  __s = (IWasmByteCodeWriter *)new<Memory::ArenaAllocator>(8,this_00,0x366bee);
  __s->_vptr_IWasmByteCodeWriter = (_func_int **)&PTR_Create_01559f00;
  this->m_emptyWriter = __s;
  if (!validateOnly) {
    __s = (IWasmByteCodeWriter *)new<Memory::ArenaAllocator>(0x138,this_00,0x366bee);
    memset(__s,0,0x138);
    __s[8]._vptr_IWasmByteCodeWriter = (_func_int **)(__s + 8);
    *(undefined4 *)&__s[9]._vptr_IWasmByteCodeWriter = 0;
    *(undefined4 *)&__s[0xb]._vptr_IWasmByteCodeWriter = 0;
    __s[10]._vptr_IWasmByteCodeWriter = (_func_int **)(__s + 10);
    *(undefined4 *)&__s[0xd]._vptr_IWasmByteCodeWriter = 0;
    __s[0xc]._vptr_IWasmByteCodeWriter = (_func_int **)(__s + 0xc);
    __s[0xf]._vptr_IWasmByteCodeWriter = (_func_int **)0x0;
    __s[0x10]._vptr_IWasmByteCodeWriter = (_func_int **)0x0;
    *(undefined8 *)((long)&__s[0x10]._vptr_IWasmByteCodeWriter + 5) = 0;
    *(undefined8 *)((long)&__s[0x11]._vptr_IWasmByteCodeWriter + 5) = 0;
    __s[0x13]._vptr_IWasmByteCodeWriter = (_func_int **)0x0;
    __s[0x14]._vptr_IWasmByteCodeWriter = (_func_int **)0x0;
    *(undefined8 *)((long)&__s[0x14]._vptr_IWasmByteCodeWriter + 5) = 0;
    *(undefined8 *)((long)&__s[0x15]._vptr_IWasmByteCodeWriter + 5) = 0;
    __s[0x17]._vptr_IWasmByteCodeWriter = (_func_int **)0x0;
    __s[0x18]._vptr_IWasmByteCodeWriter = (_func_int **)0x0;
    *(undefined8 *)((long)&__s[0x18]._vptr_IWasmByteCodeWriter + 5) = 0;
    *(undefined8 *)((long)&__s[0x19]._vptr_IWasmByteCodeWriter + 5) = 0;
    __s[0x1f]._vptr_IWasmByteCodeWriter = (_func_int **)0xffffffff;
    __s[0x20]._vptr_IWasmByteCodeWriter = (_func_int **)0x0;
    *(undefined4 *)((long)&__s[0x21]._vptr_IWasmByteCodeWriter + 4) = 1;
    __s[0x25]._vptr_IWasmByteCodeWriter = (_func_int **)0x0;
    __s->_vptr_IWasmByteCodeWriter = (_func_int **)&PTR_Create_014f2aa8;
  }
  this->m_originalWriter = __s;
  this->m_writer = __s;
  (**__s->_vptr_IWasmByteCodeWriter)(__s);
  pWVar1 = (readerInfo->m_funcInfo).ptr;
  this->m_funcInfo = pWVar1;
  pWVar2 = (readerInfo->m_module).ptr;
  this->m_module = pWVar2;
  pWVar5 = (WasmBinaryReader *)(pWVar1->m_customReader).ptr;
  if (pWVar5 == (WasmBinaryReader *)0x0) {
    pWVar5 = (pWVar2->m_reader).ptr;
  }
  (**(pWVar5->super_WasmReaderBase)._vptr_WasmReaderBase)();
  pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar5 == (WasmBinaryReader *)0x0) {
    pWVar5 = (this->m_module->m_reader).ptr;
  }
  uVar4 = (*(pWVar5->super_WasmReaderBase)._vptr_WasmReaderBase[4])();
  (*this->m_writer->_vptr_IWasmByteCodeWriter[5])(this->m_writer,this_00,(ulong)uVar4);
  return;
}

Assistant:

WasmBytecodeGenerator::WasmBytecodeGenerator(Js::ScriptContext* scriptContext, WasmReaderInfo* readerInfo, bool validateOnly) :
    m_scriptContext(scriptContext),
    m_alloc(_u("WasmBytecodeGen"), scriptContext->GetThreadContext()->GetPageAllocator(), Js::Throw::OutOfMemory),
    m_evalStack(&m_alloc),
    mTypedRegisterAllocator(&m_alloc, AllocateRegisterSpace, Simd::IsEnabled() ? 0 : 1 << WAsmJs::SIMD),
    m_blockInfos(&m_alloc),
    currentProfileId(0),
    isUnreachable(false)
{
    m_emptyWriter = Anew(&m_alloc, Js::EmptyWasmByteCodeWriter);
    m_writer = m_originalWriter = validateOnly ? m_emptyWriter : Anew(&m_alloc, Js::WasmByteCodeWriter);
    m_writer->Create();
    m_funcInfo = readerInfo->m_funcInfo;
    m_module = readerInfo->m_module;
    // Init reader to current func offset
    GetReader()->SeekToFunctionBody(m_funcInfo);

    const uint32 estimated = GetReader()->EstimateCurrentFunctionBytecodeSize();
    m_writer->InitData(&m_alloc, estimated);
}